

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O0

long __thiscall
glcts::anon_unknown_0::ExplicitUniformLocationCaseBase::runQueryUniformSubroutineFunction
          (ExplicitUniformLocationCaseBase *this,CompiledProgram *program,GLenum stage,
          SubroutineFunction *subroutineFunction,
          set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *usedIndices,
          GLint max,bool used)

{
  GLuint GVar1;
  GLenum GVar2;
  undefined8 uVar3;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *this_00;
  bool bVar4;
  string *psVar5;
  GLchar *pGVar6;
  Logger *pLVar7;
  pair<std::_Rb_tree_const_iterator<unsigned_int>,_bool> pVar8;
  Logger local_858;
  _Base_ptr local_6d8;
  undefined1 local_6d0;
  GLuint local_6c4;
  Logger local_6c0;
  _Self local_540;
  GLuint local_534;
  _Self local_530;
  Logger local_528;
  Logger local_3a8;
  GLuint local_228;
  allocator<unsigned_int> local_221;
  GLint expected;
  GLuint local_204;
  undefined1 local_200 [4];
  GLint reservedIndex;
  GLuint local_7c;
  GLenum local_78;
  GLint returnedPIQ;
  GLenum piqStage;
  GLuint local_64;
  undefined1 local_60 [4];
  GLint returned;
  string name;
  long ret;
  bool used_local;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *psStack_30;
  GLint max_local;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *usedIndices_local;
  SubroutineFunction *subroutineFunction_local;
  CompiledProgram *pCStack_18;
  GLenum stage_local;
  CompiledProgram *program_local;
  ExplicitUniformLocationCaseBase *this_local;
  
  ret._3_1_ = used;
  name.field_2._8_8_ = 0;
  ret._4_4_ = max;
  psStack_30 = usedIndices;
  usedIndices_local =
       (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
       subroutineFunction;
  subroutineFunction_local._4_4_ = stage;
  pCStack_18 = program;
  program_local = (CompiledProgram *)this;
  psVar5 = glcts::(anonymous_namespace)::SubroutineFunction::getName_abi_cxx11_
                     ((SubroutineFunction *)subroutineFunction);
  std::__cxx11::string::string((string *)local_60,(string *)psVar5);
  GVar2 = subroutineFunction_local._4_4_;
  GVar1 = pCStack_18->name;
  pGVar6 = (GLchar *)std::__cxx11::string::c_str();
  local_64 = glu::CallLogWrapper::glGetSubroutineIndex
                       (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,GVar1,GVar2,
                        pGVar6);
  local_78 = 0;
  if (subroutineFunction_local._4_4_ == 0x8b30) {
    local_78 = 0x92ec;
  }
  else if (subroutineFunction_local._4_4_ == 0x8b31) {
    local_78 = 0x92e8;
  }
  else {
    if (subroutineFunction_local._4_4_ != 0x91b9) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cExplicitUniformLocationTest.cpp"
                    ,0x77c,
                    "long glcts::(anonymous namespace)::ExplicitUniformLocationCaseBase::runQueryUniformSubroutineFunction(const CompiledProgram &, GLenum, const SubroutineFunction &, std::set<GLuint> &, GLint, bool)"
                   );
    }
    local_78 = 0x92ed;
  }
  GVar2 = local_78;
  GVar1 = pCStack_18->name;
  pGVar6 = (GLchar *)std::__cxx11::string::c_str();
  local_7c = glu::CallLogWrapper::glGetProgramResourceIndex
                       (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,GVar1,GVar2,
                        pGVar6);
  if (local_64 != local_7c) {
    name.field_2._8_8_ = 0xffffffffffffffff;
    Logger::Logger((Logger *)local_200);
    pLVar7 = glcts::(anonymous_namespace)::Logger::operator<<
                       ((Logger *)local_200,(char (*) [33])"Indices of subroutine function \"");
    pLVar7 = glcts::(anonymous_namespace)::Logger::operator<<
                       ((Logger *)pLVar7,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_60);
    pLVar7 = glcts::(anonymous_namespace)::Logger::operator<<
                       ((Logger *)pLVar7,
                        (char (*) [81])
                        "\" returned by glGetSubroutineIndex and differ glGetProgramResourceIndex differ: "
                       );
    pLVar7 = glcts::(anonymous_namespace)::Logger::operator<<((Logger *)pLVar7,(int *)&local_64);
    pLVar7 = glcts::(anonymous_namespace)::Logger::operator<<
                       ((Logger *)pLVar7,(char (*) [5])0x2a1de65);
    pLVar7 = glcts::(anonymous_namespace)::Logger::operator<<((Logger *)pLVar7,(int *)&local_7c);
    glcts::(anonymous_namespace)::Logger::operator<<((Logger *)pLVar7,(char (*) [2])0x2b5e49a);
    Logger::~Logger((Logger *)local_200);
  }
  this_00 = usedIndices_local;
  local_204 = 0xffffffff;
  std::allocator<unsigned_int>::allocator(&local_221);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&expected,1,
             (value_type_conflict4 *)((long)&subroutineFunction_local + 4),&local_221);
  bVar4 = LayoutSpecifierBase::isImplicit
                    ((LayoutSpecifierBase *)this_00,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&expected);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&expected);
  std::allocator<unsigned_int>::~allocator(&local_221);
  if (((bVar4 ^ 0xffU) & 1) == 0) {
    if ((ret._3_1_ & 1) != 0) {
      if ((int)local_64 < 0) {
        name.field_2._8_8_ = 0xffffffffffffffff;
        Logger::Logger(&local_528);
        pLVar7 = glcts::(anonymous_namespace)::Logger::operator<<
                           ((Logger *)&local_528,(char (*) [33])"Unexpected subroutine function \"")
        ;
        pLVar7 = glcts::(anonymous_namespace)::Logger::operator<<
                           ((Logger *)pLVar7,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_60);
        pLVar7 = glcts::(anonymous_namespace)::Logger::operator<<
                           ((Logger *)pLVar7,
                            (char (*) [39])"\" index: expected positive value, got ");
        pLVar7 = glcts::(anonymous_namespace)::Logger::operator<<((Logger *)pLVar7,(int *)&local_64)
        ;
        glcts::(anonymous_namespace)::Logger::operator<<((Logger *)pLVar7,(char (*) [2])0x2b5e49a);
        Logger::~Logger(&local_528);
      }
      else {
        local_204 = local_64;
      }
    }
  }
  else {
    local_228 = *(GLuint *)&(usedIndices_local->_M_t)._M_impl;
    if ((local_228 != local_64) && (((ret._3_1_ & 1) != 0 || (local_64 != 0xffffffff)))) {
      name.field_2._8_8_ = 0xffffffffffffffff;
      Logger::Logger(&local_3a8);
      pLVar7 = glcts::(anonymous_namespace)::Logger::operator<<
                         ((Logger *)&local_3a8,(char (*) [33])"Unexpected subroutine function \"");
      pLVar7 = glcts::(anonymous_namespace)::Logger::operator<<
                         ((Logger *)pLVar7,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_60);
      pLVar7 = glcts::(anonymous_namespace)::Logger::operator<<
                         ((Logger *)pLVar7,(char (*) [19])"\" index: expected ");
      pLVar7 = glcts::(anonymous_namespace)::Logger::operator<<((Logger *)pLVar7,(int *)&local_228);
      pLVar7 = glcts::(anonymous_namespace)::Logger::operator<<
                         ((Logger *)pLVar7,(char (*) [7])0x2c59494);
      pLVar7 = glcts::(anonymous_namespace)::Logger::operator<<((Logger *)pLVar7,(int *)&local_64);
      glcts::(anonymous_namespace)::Logger::operator<<((Logger *)pLVar7,(char (*) [2])0x2b5e49a);
      Logger::~Logger(&local_3a8);
    }
    local_204 = local_228;
  }
  if (-1 < (int)local_204) {
    local_534 = local_204;
    local_530._M_node =
         (_Base_ptr)
         std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::find
                   (psStack_30,&local_534);
    local_540._M_node =
         (_Base_ptr)
         std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::end
                   (psStack_30);
    bVar4 = std::operator!=(&local_530,&local_540);
    if (bVar4) {
      name.field_2._8_8_ = 0xffffffffffffffff;
      Logger::Logger(&local_6c0);
      pLVar7 = glcts::(anonymous_namespace)::Logger::operator<<
                         ((Logger *)&local_6c0,(char (*) [22])"Subroutine function \"");
      pLVar7 = glcts::(anonymous_namespace)::Logger::operator<<
                         ((Logger *)pLVar7,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_60);
      pLVar7 = glcts::(anonymous_namespace)::Logger::operator<<
                         ((Logger *)pLVar7,(char (*) [10])"\" index (");
      pLVar7 = glcts::(anonymous_namespace)::Logger::operator<<((Logger *)pLVar7,(int *)&local_204);
      glcts::(anonymous_namespace)::Logger::operator<<
                ((Logger *)pLVar7,(char (*) [17])") is not unique.");
      Logger::~Logger(&local_6c0);
    }
    local_6c4 = local_204;
    pVar8 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::insert
                      (psStack_30,&local_6c4);
    local_6d8 = (_Base_ptr)pVar8.first._M_node;
    local_6d0 = pVar8.second;
  }
  if ((-1 < (int)local_64) && (ret._4_4_ <= (int)local_64)) {
    name.field_2._8_8_ = 0xffffffffffffffff;
    Logger::Logger(&local_858);
    pLVar7 = glcts::(anonymous_namespace)::Logger::operator<<
                       ((Logger *)&local_858,(char (*) [22])"Subroutine function \"");
    pLVar7 = glcts::(anonymous_namespace)::Logger::operator<<
                       ((Logger *)pLVar7,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_60);
    pLVar7 = glcts::(anonymous_namespace)::Logger::operator<<
                       ((Logger *)pLVar7,(char (*) [19])"\" returned index (");
    pLVar7 = glcts::(anonymous_namespace)::Logger::operator<<((Logger *)pLVar7,(int *)&local_64);
    pLVar7 = glcts::(anonymous_namespace)::Logger::operator<<
                       ((Logger *)pLVar7,
                        (char (*) [51])") is greater than implementation dependent limit (");
    pLVar7 = glcts::(anonymous_namespace)::Logger::operator<<
                       ((Logger *)pLVar7,(int *)((long)&ret + 4));
    glcts::(anonymous_namespace)::Logger::operator<<((Logger *)pLVar7,(char (*) [3])0x2c156ab);
    Logger::~Logger(&local_858);
  }
  uVar3 = name.field_2._8_8_;
  std::__cxx11::string::~string((string *)local_60);
  return uVar3;
}

Assistant:

long runQueryUniformSubroutineFunction(const CompiledProgram& program, GLenum stage,
										   const SubroutineFunction& subroutineFunction, std::set<GLuint>& usedIndices,
										   GLint max, bool used)
	{
		long ret = NO_ERROR;
		/*
		 glGetSubroutineIndex(program, shaderType, name)
		 Query passes if returned value is unique in current program stage,
		 matches explicit index (if passed in GLSL code) and is less than value
		 of GL_MAX_SUBROUTINES.

		 glGetProgramResourceIndex(program, GL_(VERTEX|FRAGMENT|COMPUTE|...
		 ..._SUBROUTINE, name)
		 Query passes if returned value matches value returned from
		 glGetSubroutineIndex().
		 */

		std::string name = subroutineFunction.getName();

		GLint returned = glGetSubroutineIndex(program.name, stage, name.c_str());

		glw::GLenum piqStage = 0;
		switch (stage)
		{
		case GL_VERTEX_SHADER:
			piqStage = GL_VERTEX_SUBROUTINE;
			break;
		case GL_FRAGMENT_SHADER:
			piqStage = GL_FRAGMENT_SUBROUTINE;
			break;
		case GL_COMPUTE_SHADER:
			piqStage = GL_COMPUTE_SUBROUTINE;
			break;
		default:
			assert(0);
		}

		GLint returnedPIQ = glGetProgramResourceIndex(program.name, piqStage, name.c_str());

		if (returned != returnedPIQ)
		{
			ret |= ERROR;
			Logger() << "Indices of subroutine function \"" << name
					 << "\" returned by glGetSubroutineIndex and differ glGetProgramResourceIndex differ: " << returned
					 << " != " << returnedPIQ << ".";
		}

		GLint reservedIndex = -1;

		if (!subroutineFunction.index.isImplicit(std::vector<glw::GLenum>(1, stage)))
		{
			//Validate uniform location against explicit value
			GLint expected = subroutineFunction.index.val;
			if (!(expected == returned || (!used && returned == -1)))
			{
				ret |= ERROR;
				Logger() << "Unexpected subroutine function \"" << name << "\" index: expected " << expected << ", got "
						 << returned << ".";
			}

			reservedIndex = expected;
		}
		else
		{
			//Check if location > 0 if used;
			if (used)
			{
				if (returned < 0)
				{
					ret |= ERROR;
					Logger() << "Unexpected subroutine function \"" << name << "\" index: expected positive value, got "
							 << returned << ".";
				}
				else
				{
					reservedIndex = returned;
				}
			}
		}

		if (reservedIndex >= 0)
		{
			//check if location is unique
			if (usedIndices.find(reservedIndex) != usedIndices.end())
			{
				ret |= ERROR;
				Logger() << "Subroutine function \"" << name << "\" index (" << reservedIndex << ") is not unique.";
			}
			usedIndices.insert(reservedIndex);
		}

		if (returned >= 0)
		{
			//check if location is less than max

			if (returned >= max)
			{
				ret |= ERROR;
				Logger() << "Subroutine function \"" << name << "\" returned index (" << returned
						 << ") is greater than implementation dependent limit (" << max << ").";
			}
		}

		return ret;
	}